

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

char * sx_os_path_splitext(char *ext,int ext_size,char *basename,int basename_size,char *path)

{
  code *pcVar1;
  uint uVar2;
  char *pcVar3;
  int _num;
  
  if (ext == path) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/os.c",0x20a
                      ,"ext != path");
    pcVar1 = (code *)swi(3);
    pcVar3 = (char *)(*pcVar1)();
    return pcVar3;
  }
  uVar2 = sx_strlen(path);
  if (0 < (int)uVar2) {
    pcVar3 = sx_strrchar(path,'/');
    if (pcVar3 == (char *)0x0) {
      pcVar3 = sx_strrchar(path,'\\');
    }
    if (pcVar3 == (char *)0x0) {
      pcVar3 = path;
    }
    if (pcVar3 < path + ((ulong)uVar2 - 1)) {
      _num = (int)pcVar3 - (int)path;
      do {
        if (*pcVar3 == '.') {
          sx_strcpy(ext,ext_size,pcVar3);
          if (basename != path) {
            sx_strncpy(basename,basename_size,path,_num);
            return ext;
          }
          *pcVar3 = '\0';
          return ext;
        }
        pcVar3 = pcVar3 + 1;
        _num = _num + 1;
      } while (pcVar3 < path + ((ulong)uVar2 - 1));
    }
  }
  *ext = '\0';
  if (basename != path) {
    sx_strcpy(basename,basename_size,path);
  }
  return ext;
}

Assistant:

char* sx_os_path_splitext(char* ext, int ext_size, char* basename, int basename_size,
                          const char* path)
{
    sx_assert(ext != path);

    int len = sx_strlen(path);
    if (len > 0) {
        const char* start = sx_strrchar(path, '/');
        if (!start)
            start = sx_strrchar(path, '\\');
        if (!start)
            start = path;
        const char* end = &path[len - 1];
        for (const char* e = start; e < end; ++e) {
            if (*e != '.')
                continue;
            sx_strcpy(ext, ext_size, e);
            if (basename != path)
                sx_strncpy(basename, basename_size, path, (int)(intptr_t)(e - path));
            else
                *((char*)e) = '\0';
            return ext;
        }
    }

    // no extension (.) found
    ext[0] = '\0';
    if (basename != path)
        sx_strcpy(basename, basename_size, path);
    return ext;
}